

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t internal_exr_write_header(exr_context_t ctxt)

{
  exr_priv_part_t p_Var1;
  bool bVar2;
  int iVar3;
  exr_const_context_t_conflict in_RDI;
  int a_1;
  exr_attribute_t *curattr;
  int a;
  exr_priv_part_t curp;
  int p;
  uint8_t next_byte;
  uint32_t flags;
  uint32_t magic_and_version [2];
  exr_result_t rv;
  int local_44;
  exr_attribute_t *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int local_28;
  undefined1 local_21;
  uint local_20 [3];
  exr_result_t local_14;
  exr_const_context_t_conflict local_10;
  exr_result_t local_4;
  
  local_10 = in_RDI;
  local_14 = internal_exr_calc_header_version_flags(in_RDI,local_20);
  local_20[1] = 0x1312f76;
  local_20[2] = local_20[0];
  priv_from_native32(local_20 + 1,2);
  local_14 = (*local_10->do_write)(local_10,local_20 + 1,8,&local_10->output_file_offset);
  local_4 = local_14;
  if (local_14 == 0) {
    local_28 = 0;
    while( true ) {
      bVar2 = false;
      if (local_14 == 0) {
        bVar2 = local_28 < local_10->num_parts;
      }
      if (!bVar2) break;
      p_Var1 = local_10->parts[local_28];
      if (local_10->legacy_header == '\0') {
        local_44 = 0;
        while ((local_44 < (p_Var1->attributes).num_attributes &&
               (local_14 = save_attr((exr_context_t)
                                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                     in_stack_ffffffffffffffc0), local_14 == 0))) {
          local_44 = local_44 + 1;
        }
      }
      else {
        in_stack_ffffffffffffffcc = 0;
        while ((in_stack_ffffffffffffffcc < (p_Var1->attributes).num_attributes &&
               ((((in_stack_ffffffffffffffc0 =
                        (p_Var1->attributes).sorted_entries[in_stack_ffffffffffffffcc],
                  (local_20[0] & 0x1800) == 0 && (local_10->num_parts == 1)) &&
                 ((iVar3 = strcmp(in_stack_ffffffffffffffc0->name,"type"), iVar3 == 0 ||
                  (iVar3 = strcmp(in_stack_ffffffffffffffc0->name,"name"), iVar3 == 0)))) ||
                (local_14 = save_attr((exr_context_t)
                                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                      in_stack_ffffffffffffffc0), local_14 == 0))))) {
          in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc + 1;
        }
      }
      if (local_14 == 0) {
        local_21 = 0;
        local_14 = (*local_10->do_write)(local_10,&local_21,1,&local_10->output_file_offset);
      }
      local_28 = local_28 + 1;
    }
    if ((local_14 == 0) && (local_10->is_multipart != '\0')) {
      local_21 = 0;
      local_14 = (*local_10->do_write)(local_10,&local_21,1,&local_10->output_file_offset);
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

exr_result_t
internal_exr_write_header (exr_context_t ctxt)
{
    exr_result_t rv;
    uint32_t     magic_and_version[2];
    uint32_t     flags;
    uint8_t      next_byte;

    rv = internal_exr_calc_header_version_flags (ctxt, &flags);

    magic_and_version[0] = 20000630;
    magic_and_version[1] = flags;

    priv_from_native32 (magic_and_version, 2);

    rv = ctxt->do_write (
        ctxt,
        magic_and_version,
        sizeof (uint32_t) * 2,
        &(ctxt->output_file_offset));
    if (rv != EXR_ERR_SUCCESS) return rv;

    for (int p = 0; rv == EXR_ERR_SUCCESS && p < ctxt->num_parts; ++p)
    {
        exr_priv_part_t curp = ctxt->parts[p];
        if (ctxt->legacy_header)
        {
            for (int a = 0; a < curp->attributes.num_attributes; ++a)
            {
                exr_attribute_t* curattr = curp->attributes.sorted_entries[a];
                if (0 == (flags & (EXR_MULTI_PART_FLAG | EXR_NON_IMAGE_FLAG)) &&
                    1 == ctxt->num_parts)
                {
                    if (0 == strcmp (curattr->name, "type") ||
                        0 == strcmp (curattr->name, "name"))
                    {
                        /* old file wouldn't have had this */
                        continue;
                    }
                }
                rv = save_attr (ctxt, curattr);
                if (rv != EXR_ERR_SUCCESS) break;
            }
        }
        else
        {
            for (int a = 0; a < curp->attributes.num_attributes; ++a)
            {
                rv = save_attr (ctxt, curp->attributes.entries[a]);
                if (rv != EXR_ERR_SUCCESS) break;
            }
        }

        /* indicate this part is finished */
        if (rv == EXR_ERR_SUCCESS)
        {
            next_byte = 0;
            rv        = ctxt->do_write (
                ctxt,
                &next_byte,
                sizeof (uint8_t),
                &(ctxt->output_file_offset));
        }
    }

    /* for multipart write a double terminator at the end */
    if (rv == EXR_ERR_SUCCESS && ctxt->is_multipart)
    {
        next_byte = 0;
        rv        = ctxt->do_write (
            ctxt, &next_byte, sizeof (uint8_t), &(ctxt->output_file_offset));
    }

    return rv;
}